

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
boost::ext::ut::v1_1_8::utility::string_view::operator_cast_to_string
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,string_view *this)

{
  char *pcVar1;
  unsigned_long uVar2;
  
  pcVar1 = this->data_;
  uVar2 = this->size_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + uVar2);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] constexpr operator T() const {
      return T{data_, size_};
    }